

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O2

vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_> * __thiscall
QPDFAcroFormDocumentHelper::getFormFieldsForPage
          (vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>
           *__return_storage_ptr__,QPDFAcroFormDocumentHelper *this,QPDFPageObjectHelper *ph)

{
  bool bVar1;
  QPDFObjGen og;
  pointer pQVar2;
  set todo;
  QPDFFormFieldObjectHelper field;
  vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> local_158;
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  local_140;
  QPDFFormFieldObjectHelper local_110;
  QPDFFormFieldObjectHelper local_d8;
  QPDFAnnotationObjectHelper local_a0;
  QPDFPageObjectHelper local_68;
  
  analyze(this);
  local_140._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_140._M_impl.super__Rb_tree_header._M_header;
  local_140._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_140._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_140._M_impl.super__Rb_tree_header._M_node_count = 0;
  (__return_storage_ptr__->
  super__Vector_base<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_140._M_impl.super__Rb_tree_header._M_header._M_right =
       local_140._M_impl.super__Rb_tree_header._M_header._M_left;
  QPDFPageObjectHelper::QPDFPageObjectHelper(&local_68,ph);
  getWidgetAnnotationsForPage(&local_158,(QPDFAcroFormDocumentHelper *)ph,&local_68);
  QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_68);
  for (pQVar2 = local_158.
                super__Vector_base<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pQVar2 != local_158.
                super__Vector_base<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>
                ._M_impl.super__Vector_impl_data._M_finish; pQVar2 = pQVar2 + 1) {
    QPDFAnnotationObjectHelper::QPDFAnnotationObjectHelper(&local_a0,pQVar2);
    getFieldForAnnotation(&local_110,this,&local_a0);
    QPDFFormFieldObjectHelper::getTopLevelField(&local_d8,&local_110,(bool *)0x0);
    QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper(&local_110);
    QPDFAnnotationObjectHelper::~QPDFAnnotationObjectHelper(&local_a0);
    og = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen
                   (&local_d8.super_QPDFObjectHelper.super_BaseHandle);
    bVar1 = QPDFObjGen::set::add((set *)&local_140,og);
    if (bVar1) {
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_110,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                 &local_d8.super_QPDFObjectHelper.super_BaseHandle);
      bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)&local_110);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_110.super_QPDFObjectHelper.super_BaseHandle);
      if (bVar1) {
        std::vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>::
        push_back(__return_storage_ptr__,&local_d8);
      }
    }
    QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper(&local_d8);
  }
  std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>::~vector
            (&local_158);
  std::
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  ::~_Rb_tree(&local_140);
  return __return_storage_ptr__;
}

Assistant:

std::vector<QPDFFormFieldObjectHelper>
QPDFAcroFormDocumentHelper::getFormFieldsForPage(QPDFPageObjectHelper ph)
{
    analyze();
    QPDFObjGen::set todo;
    std::vector<QPDFFormFieldObjectHelper> result;
    for (auto& annot: getWidgetAnnotationsForPage(ph)) {
        auto field = getFieldForAnnotation(annot).getTopLevelField();
        if (todo.add(field) && field.getObjectHandle().isDictionary()) {
            result.push_back(field);
        }
    }
    return result;
}